

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O3

void __thiscall QTipLabel::restartExpireTimer(QTipLabel *this,int msecDisplayTime)

{
  long lVar1;
  FocusPolicy FVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QLabel).super_QFrame.super_QWidget.field_0x8;
  if ((*(byte *)(lVar1 + 0x340) & 0x10) == 0) {
LAB_0039ed65:
    QLabel::text(&local_38,&this->super_QLabel);
  }
  else {
    if ((*(int *)(lVar1 + 0x328) == 0) && ((*(byte *)(lVar1 + 0x32c) & 3) == 0)) {
      FVar2 = QWidget::focusPolicy(*(QWidget **)(lVar1 + 8));
      if (FVar2 == NoFocus) goto LAB_0039ed65;
    }
    QWidgetTextControl::toPlainText(&local_38,*(QWidgetTextControl **)(lVar1 + 0x2f8));
  }
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  uVar3 = 100;
  if (100 < (ulong)local_38.d.size) {
    uVar3 = local_38.d.size;
  }
  if (msecDisplayTime < 1) {
    msecDisplayTime = (int)uVar3 * 0x28 + 6000;
  }
  QBasicTimer::start(&this->expireTimer,(long)msecDisplayTime * 1000000,1,this);
  QBasicTimer::stop();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTipLabel::restartExpireTimer(int msecDisplayTime)
{
    Q_D(const QLabel);
    const qsizetype textLength = d->needTextControl() ? d->control->toPlainText().size() : text().size();
    qsizetype time = 10000 + 40 * qMax(0, textLength - 100);
    if (msecDisplayTime > 0)
        time = msecDisplayTime;
    expireTimer.start(time, this);
    hideTimer.stop();
}